

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O3

U32 __thiscall
SpiAnalyzer::GenerateSimulationData
          (SpiAnalyzer *this,U64 minimum_sample_index,U32 device_sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U32 UVar1;
  
  if (this->mSimulationInitilized == false) {
    UVar1 = Analyzer::GetSimulationSampleRate();
    SpiSimulationDataGenerator::Initialize
              (&this->mSimulationDataGenerator,UVar1,(this->mSettings)._M_ptr);
    this->mSimulationInitilized = true;
  }
  UVar1 = SpiSimulationDataGenerator::GenerateSimulationData
                    (&this->mSimulationDataGenerator,minimum_sample_index,device_sample_rate,
                     simulation_channels);
  return UVar1;
}

Assistant:

U32 SpiAnalyzer::GenerateSimulationData( U64 minimum_sample_index, U32 device_sample_rate,
                                         SimulationChannelDescriptor** simulation_channels )
{
    if( mSimulationInitilized == false )
    {
        mSimulationDataGenerator.Initialize( GetSimulationSampleRate(), mSettings.get() );
        mSimulationInitilized = true;
    }

    return mSimulationDataGenerator.GenerateSimulationData( minimum_sample_index, device_sample_rate, simulation_channels );
}